

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O0

Type * slang::ast::builtins::PlaTask::badRange(ASTContext *context,Expression *arg)

{
  Diagnostic *diag;
  Type *pTVar1;
  Compilation *this;
  Expression *arg_local;
  ASTContext *context_local;
  
  diag = ASTContext::addDiag(context,(DiagCode)0x1c000b,arg->sourceRange);
  pTVar1 = not_null<const_slang::ast::Type_*>::operator*(&arg->type);
  ast::operator<<(diag,pTVar1);
  this = ASTContext::getCompilation(context);
  pTVar1 = Compilation::getErrorType(this);
  return pTVar1;
}

Assistant:

static const Type& badRange(const ASTContext& context, const Expression& arg) {
        context.addDiag(diag::PlaRangeInAscendingOrder, arg.sourceRange) << *arg.type;
        return context.getCompilation().getErrorType();
    }